

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

void glfwGetMonitorWorkarea(GLFWmonitor *handle,int *xpos,int *ypos,int *width,int *height)

{
  int iVar1;
  int iVar2;
  XRRScreenResources *pXVar3;
  XRRCrtcInfo *pXVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  XRRModeInfo *pXVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  _GLFWmonitor *monitor;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  ulong *puStack_58;
  uchar *puStack_50;
  int *piStack_48;
  int *piStack_40;
  int *piStack_38;
  
  if (xpos != (int *)0x0) {
    *xpos = 0;
  }
  if (ypos != (int *)0x0) {
    *ypos = 0;
  }
  if (width != (int *)0x0) {
    *width = 0;
  }
  if (height != (int *)0x0) {
    *height = 0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  piStack_48 = xpos;
  piStack_40 = ypos;
  piStack_38 = width;
  if ((_glfw.x11.randr.available == 0) || (_glfw.x11.randr.monitorBroken != 0)) {
    iVar13 = *(int *)(*(long *)(_glfw.x11.display + 0xe8) + 0x18 + (long)_glfw.x11.screen * 0x80);
    iVar10 = *(int *)(*(long *)(_glfw.x11.display + 0xe8) + 0x1c + (long)_glfw.x11.screen * 0x80);
    iVar14 = 0;
    iVar15 = 0;
  }
  else {
    pXVar3 = (*_glfw.x11.randr.GetScreenResourcesCurrent)(_glfw.x11.display,_glfw.x11.root);
    pXVar4 = (*_glfw.x11.randr.GetCrtcInfo)(_glfw.x11.display,pXVar3,*(RRCrtc *)(handle + 0x90));
    lVar9 = (long)pXVar3->nmode;
    if (0 < lVar9) {
      pXVar7 = pXVar3->modes;
      do {
        if (pXVar7->id == pXVar4->mode) goto LAB_00151966;
        pXVar7 = pXVar7 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    pXVar7 = (XRRModeInfo *)0x0;
LAB_00151966:
    lVar9 = 8;
    lVar11 = 0xc;
    if ((pXVar4->rotation != 2) && (pXVar4->rotation != 8)) {
      lVar9 = 0xc;
      lVar11 = 8;
    }
    iVar15 = pXVar4->x;
    iVar14 = pXVar4->y;
    iVar13 = *(int *)((long)&pXVar7->id + lVar11);
    iVar10 = *(int *)((long)&pXVar7->id + lVar9);
    (*_glfw.x11.randr.FreeCrtcInfo)(pXVar4);
    (*_glfw.x11.randr.FreeScreenResources)(pXVar3);
  }
  if ((_glfw.x11.NET_WORKAREA == 0) || (_glfw.x11.NET_CURRENT_DESKTOP == 0)) goto LAB_00151b14;
  puStack_50 = (uchar *)0x0;
  puStack_58 = (ulong *)0x0;
  uVar5 = _glfwGetWindowPropertyX11(_glfw.x11.root,_glfw.x11.NET_WORKAREA,6,&puStack_50);
  uVar6 = _glfwGetWindowPropertyX11
                    (_glfw.x11.root,_glfw.x11.NET_CURRENT_DESKTOP,6,(uchar **)&puStack_58);
  if ((uVar6 == 0 || uVar5 < 4) || (uVar5 >> 2 <= *puStack_58)) {
    if (puStack_50 != (uchar *)0x0) goto LAB_00151afe;
  }
  else {
    lVar9 = *puStack_58 * 0x20;
    iVar1 = *(int *)(puStack_50 + lVar9);
    iVar2 = *(int *)(puStack_50 + lVar9 + 8);
    iVar12 = iVar15 - iVar1;
    bVar16 = iVar12 == 0;
    if (iVar1 <= iVar15) {
      iVar12 = 0;
    }
    if (bVar16 || iVar15 < iVar1) {
      iVar15 = iVar1;
    }
    iVar12 = iVar12 + iVar13;
    iVar8 = iVar14 - iVar2;
    bVar16 = iVar8 == 0;
    if (iVar2 <= iVar14) {
      iVar8 = 0;
    }
    if (bVar16 || iVar14 < iVar2) {
      iVar14 = iVar2;
    }
    iVar8 = iVar8 + iVar10;
    iVar13 = (iVar1 - iVar15) + *(int *)(puStack_50 + lVar9 + 0x10);
    if (iVar12 + iVar15 <= *(int *)(puStack_50 + lVar9 + 0x10) + iVar1) {
      iVar13 = iVar12;
    }
    iVar10 = (iVar2 - iVar14) + *(int *)(puStack_50 + lVar9 + 0x18);
    if (iVar8 + iVar14 <= *(int *)(puStack_50 + lVar9 + 0x18) + iVar2) {
      iVar10 = iVar8;
    }
LAB_00151afe:
    (*_glfw.x11.xlib.Free)(puStack_50);
  }
  if (puStack_58 != (ulong *)0x0) {
    (*_glfw.x11.xlib.Free)(puStack_58);
  }
LAB_00151b14:
  if (piStack_48 != (int *)0x0) {
    *piStack_48 = iVar15;
  }
  if (piStack_40 != (int *)0x0) {
    *piStack_40 = iVar14;
  }
  if (piStack_38 != (int *)0x0) {
    *piStack_38 = iVar13;
  }
  if (height != (int *)0x0) {
    *height = iVar10;
  }
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorWorkarea(GLFWmonitor* handle,
                                    int* xpos, int* ypos,
                                    int* width, int* height)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;
    if (width)
        *width = 0;
    if (height)
        *height = 0;

    _GLFW_REQUIRE_INIT();

    _glfwPlatformGetMonitorWorkarea(monitor, xpos, ypos, width, height);
}